

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testJacobiEigenSolver.cpp
# Opt level: O0

void testJacobiEigenSolver<Imath_3_2::Matrix44<float>>(Matrix44<float> *A)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  float *pfVar5;
  int iVar6;
  Matrix44<float> *in_RDI;
  Matrix44<float> *this;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  float extraout_XMM0_Da_02;
  uint j_1;
  uint i_1;
  Matrix44<float> MA;
  uint j;
  uint i;
  Matrix44<float> MS;
  Matrix44<float> V;
  TV S;
  Matrix44<float> AA;
  T threshold;
  undefined4 in_stack_fffffffffffffe40;
  float fVar7;
  float in_stack_fffffffffffffe48;
  uint in_stack_fffffffffffffe4c;
  undefined4 in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe54;
  undefined4 in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe5c;
  Matrix44<float> *in_stack_fffffffffffffe60;
  Matrix44<float> *in_stack_fffffffffffffe78;
  BaseType_conflict2 in_stack_fffffffffffffecc;
  Matrix44<float> *in_stack_fffffffffffffed0;
  Matrix44<float> local_124;
  uint local_e4;
  uint local_e0;
  Matrix44<float> local_dc;
  Matrix44<float> local_9c;
  Vec4<float> local_5c;
  Matrix44<float> local_4c;
  BaseType_conflict2 local_c;
  Matrix44<float> *local_8;
  
  local_8 = in_RDI;
  local_c = computeThreshold<Imath_3_2::Matrix44<float>>
                      ((Matrix44<float> *)
                       CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
  Imath_3_2::Matrix44<float>::Matrix44(&local_4c,local_8);
  Imath_3_2::Vec4<float>::Vec4(&local_5c);
  Imath_3_2::Matrix44<float>::Matrix44(&local_9c);
  Imath_3_2::jacobiEigenSolver<float>
            (in_stack_fffffffffffffe60,
             (Vec4<float> *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
             (Matrix44<float> *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
  verifyOrthonormal<Imath_3_2::Matrix44<float>>(in_stack_fffffffffffffed0,in_stack_fffffffffffffecc)
  ;
  iVar6 = (int)&local_9c;
  Imath_3_2::Matrix44<float>::determinant(in_stack_fffffffffffffe60);
  std::abs(iVar6);
  if (local_c <= extraout_XMM0_Da - 1.0) {
    __assert_fail("abs (V.determinant ()) - 1 < threshold",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testJacobiEigenSolver.cpp"
                  ,0x67,"void testJacobiEigenSolver(const TM &) [TM = Imath_3_2::Matrix44<float>]");
  }
  Imath_3_2::Matrix44<float>::Matrix44(&local_dc);
  local_e0 = 0;
  while( true ) {
    uVar2 = local_e0;
    uVar1 = Imath_3_2::Matrix44<float>::dimensions();
    if (uVar1 <= uVar2) break;
    local_e4 = 0;
    while( true ) {
      in_stack_fffffffffffffe4c = local_e4;
      uVar2 = Imath_3_2::Matrix44<float>::dimensions();
      if (uVar2 <= in_stack_fffffffffffffe4c) break;
      if (local_e0 == local_e4) {
        pfVar5 = Imath_3_2::Vec4<float>::operator[](&local_5c,local_e0);
        in_stack_fffffffffffffe48 = *pfVar5;
        pfVar5 = Imath_3_2::Matrix44<float>::operator[](&local_dc,local_e0);
        pfVar5[local_e4] = in_stack_fffffffffffffe48;
      }
      else {
        pfVar5 = Imath_3_2::Matrix44<float>::operator[](&local_dc,local_e0);
        pfVar5[local_e4] = 0.0;
      }
      local_e4 = local_e4 + 1;
    }
    local_e0 = local_e0 + 1;
  }
  iVar6 = (int)local_8;
  Imath_3_2::Matrix44<float>::determinant(in_stack_fffffffffffffe60);
  std::abs(iVar6);
  iVar6 = (int)&local_dc;
  fVar7 = extraout_XMM0_Da_00;
  Imath_3_2::Matrix44<float>::determinant(in_stack_fffffffffffffe60);
  std::abs(iVar6);
  if (fVar7 - extraout_XMM0_Da_01 < local_c) {
    Imath_3_2::Matrix44<float>::operator*
              ((Matrix44<float> *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
               (Matrix44<float> *)CONCAT44(fVar7,in_stack_fffffffffffffe40));
    Imath_3_2::Matrix44<float>::transposed(in_stack_fffffffffffffe78);
    Imath_3_2::Matrix44<float>::operator*
              ((Matrix44<float> *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
               (Matrix44<float> *)CONCAT44(fVar7,in_stack_fffffffffffffe40));
    uVar2 = 0;
    do {
      uVar1 = uVar2;
      uVar3 = Imath_3_2::Matrix44<float>::dimensions();
      if (uVar3 <= uVar2) {
        return;
      }
      uVar2 = 0;
      while( true ) {
        uVar3 = uVar2;
        uVar4 = Imath_3_2::Matrix44<float>::dimensions();
        if (uVar4 <= uVar2) break;
        Imath_3_2::Matrix44<float>::operator[](local_8,uVar1);
        this = &local_124;
        Imath_3_2::Matrix44<float>::operator[](this,uVar1);
        std::abs((int)this);
        if (local_c <= extraout_XMM0_Da_02) {
          __assert_fail("abs (A[i][j] - MA[i][j]) < threshold",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testJacobiEigenSolver.cpp"
                        ,0x79,
                        "void testJacobiEigenSolver(const TM &) [TM = Imath_3_2::Matrix44<float>]");
        }
        uVar2 = uVar3 + 1;
      }
      uVar2 = uVar1 + 1;
    } while( true );
  }
  __assert_fail("abs (A.determinant ()) - abs (MS.determinant ()) < threshold",
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testJacobiEigenSolver.cpp"
                ,0x72,"void testJacobiEigenSolver(const TM &) [TM = Imath_3_2::Matrix44<float>]");
}

Assistant:

void
testJacobiEigenSolver (const TM& A)
{
    using std::abs;

    typedef typename TM::BaseType    T;
    typedef typename TM::BaseVecType TV;

    const T threshold = computeThreshold (A);

    TM AA (A);
    TV S;
    TM V;

    jacobiEigenSolver (AA, S, V);

    // Orthogonality of V
    verifyOrthonormal (V, threshold);

    // Determinant of V
    assert (abs (V.determinant ()) - 1 < threshold);

    // Determinant of A and S
    TM MS;
    for (unsigned int i = 0; i < TM::dimensions (); ++i)
        for (unsigned int j = 0; j < TM::dimensions (); ++j)
            if (i == j)
                MS[i][j] = S[i];
            else
                MS[i][j] = 0;

    assert (abs (A.determinant ()) - abs (MS.determinant ()) < threshold);

    // A = V * S * V^T
    TM MA = V * MS * V.transposed ();

    for (unsigned int i = 0; i < TM::dimensions (); ++i)
        for (unsigned int j = 0; j < TM::dimensions (); ++j)
            assert (abs (A[i][j] - MA[i][j]) < threshold);
}